

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  pointer ppTVar1;
  auto_ptr<cmCompiledGeneratorExpression> aVar2;
  const_iterator __position;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmListFileBacktrace lfbt;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_80;
  auto_ptr<cmCompiledGeneratorExpression> local_78;
  undefined1 local_70 [40];
  string local_48;
  
  this_00 = this->Target;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)(local_70 + 8),this->Makefile);
  cmTarget::InsertInclude(this_00,src,(cmListFileBacktrace *)(local_70 + 8),before);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_70 + 8));
  cmMakefile::GetBacktrace((cmListFileBacktrace *)(local_70 + 8),this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&local_48,(cmListFileBacktrace *)(local_70 + 8));
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,&local_48);
  local_80.x_ = (cmCompiledGeneratorExpression *)local_70._0_8_;
  local_70._0_8_ = (cmState *)0x0;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  aVar2.x_ = local_80.x_;
  (local_80.x_)->EvaluateForBuildsystem = true;
  ppTVar1 = (this->IncludeDirectoriesEntries).
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->IncludeDirectoriesEntries).
       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_70._0_8_ = operator_new(0x10);
  if (before) {
    __position._M_current = ppTVar1;
  }
  local_80.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_78.x_ = (cmCompiledGeneratorExpression *)0x0;
  *(cmCompiledGeneratorExpression **)
   &(((cmState *)local_70._0_8_)->PropertyDefinitions)._M_t._M_impl = aVar2.x_;
  *(cmLinkImplItem **)
   &(((cmState *)local_70._0_8_)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header
       = &TargetPropertyEntry::NoLinkImplItem;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::_M_insert_rval(&this->IncludeDirectoriesEntries,__position,(value_type *)local_70);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_78);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_80);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_48);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_70 + 8));
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(src, this->Makefile->GetBacktrace(), before);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  // Insert before begin/end
  std::vector<TargetPropertyEntry*>::iterator pos = before
    ? this->IncludeDirectoriesEntries.begin()
    : this->IncludeDirectoriesEntries.end();
  this->IncludeDirectoriesEntries.insert(pos, new TargetPropertyEntry(cge));
}